

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::PrintHeapBlockStats(Recycler *this,char16 *name,HeapBlockType type)

{
  size_t sVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar3 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  sVar1 = (this->collectionStats).heapBlockFreeCount[uVar3];
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  sVar2 = (this->collectionStats).heapBlockCount[uVar3];
  auVar8._8_4_ = (int)(sVar2 >> 0x20);
  auVar8._0_8_ = sVar2;
  auVar8._12_4_ = 0x45300000;
  lVar4 = sVar2 - sVar1;
  Output::Print(L" %6s : %5d %5d %5d %5.1f",
                ((((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                 (auVar6._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                (auVar8._8_8_ - 1.9342813113834067e+25))) * 100.0,name,lVar4);
  if (type < LargeBlockType) {
    sVar1 = (this->collectionStats).heapBlockSweptCount[uVar3];
    auVar7._8_4_ = (int)(sVar1 >> 0x20);
    auVar7._0_8_ = sVar1;
    auVar7._12_4_ = 0x45300000;
    dVar5 = ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
            (auVar7._8_8_ - 1.9342813113834067e+25);
    auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = 0x45300000;
    sVar1 = (this->collectionStats).heapBlockConcurrentSweptCount[uVar3];
    auVar9._8_4_ = (int)(sVar1 >> 0x20);
    auVar9._0_8_ = sVar1;
    auVar9._12_4_ = 0x45300000;
    Output::Print(L" : %5d %6.1f : %5d %6.1f",
                  (dVar5 / (((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) +
                           (auVar10._8_8_ - 1.9342813113834067e+25))) * 100.0,
                  ((((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                   (auVar9._8_8_ - 1.9342813113834067e+25)) / dVar5) * 100.0);
    return;
  }
  return;
}

Assistant:

void
Recycler::PrintHeapBlockStats(char16 const * name, HeapBlock::HeapBlockType type)
{
    size_t liveCount = collectionStats.heapBlockCount[type] - collectionStats.heapBlockFreeCount[type];

    Output::Print(_u(" %6s : %5d %5d %5d %5.1f"), name,
        liveCount, collectionStats.heapBlockFreeCount[type], collectionStats.heapBlockCount[type],
        (double)collectionStats.heapBlockFreeCount[type] / (double)collectionStats.heapBlockCount[type] * 100);

    if (type < HeapBlock::SmallBlockTypeCount)
    {
        Output::Print(_u(" : %5d %6.1f : %5d %6.1f"),
            collectionStats.heapBlockSweptCount[type],
            (double)collectionStats.heapBlockSweptCount[type] / (double)liveCount * 100,
            collectionStats.heapBlockConcurrentSweptCount[type],
            (double)collectionStats.heapBlockConcurrentSweptCount[type] / (double)collectionStats.heapBlockSweptCount[type] * 100);
    }
}